

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.hpp
# Opt level: O3

bool __thiscall
mp::NLSolver::LoadModel<mp::NLW2_NLFeeder_C_Impl>(NLSolver *this,NLW2_NLFeeder_C_Impl *nlf)

{
  WriteNLResult result;
  WriteNLResult local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->filestub_)._M_string_length == 0) {
    InitAutoStub(this);
  }
  WriteNLFile<mp::NLW2_NLFeeder_C_Impl>(&local_70,&this->filestub_,nlf,this->p_ut_);
  if (local_70.first != NLW2_WriteNL_OK) {
    std::operator+(&local_48,"WriteNL error: ",&local_70.second);
    std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity + 1);
  }
  return local_70.first == NLW2_WriteNL_OK;
}

Assistant:

bool NLSolver::LoadModel(NLFeeder& nlf) {
  if (GetFileStub().empty())
    InitAutoStub();
  auto result = mp::WriteNLFile(GetFileStub(), nlf, Utils());
  if (NLW2_WriteNL_OK != result.first)
    return (err_msg_ = "WriteNL error: " + result.second, false);
  return true;
}